

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtils.cpp
# Opt level: O3

void ApprovalTests::FileUtils::writeToFile(string *filePath,string *content)

{
  runtime_error *this;
  ofstream out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  long local_220;
  filebuf local_218 [24];
  byte abStack_200 [216];
  ios_base local_128 [264];
  
  ::std::ofstream::ofstream(&local_220,(filePath->_M_dataplus)._M_p,_S_out|_S_bin);
  if ((abStack_200[*(long *)(local_220 + -0x18)] & 5) == 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,(content->_M_dataplus)._M_p,content->_M_string_length);
    local_220 = _VTT;
    *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
    ::std::filebuf::~filebuf(local_218);
    ::std::ios_base::~ios_base(local_128);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::operator+(&local_240,"Unable to write file: ",filePath);
  ::std::runtime_error::runtime_error(this,(string *)&local_240);
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void FileUtils::writeToFile(const std::string& filePath, const std::string& content)
    {
        std::ofstream out(filePath.c_str(), std::ios::binary | std::ofstream::out);
        if (!out)
        {
            throw std::runtime_error("Unable to write file: " + filePath);
        }
        out << content;
    }